

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

ssize_t read_stream(archive_read *a,void **buff,size_t size,size_t minimum)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  ssize_t sVar4;
  ssize_t skipped;
  ssize_t r;
  uint64_t skip_bytes;
  _7zip *zip;
  size_t minimum_local;
  size_t size_local;
  void **buff_local;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  r = 0;
  if (*(long *)((long)pvVar1 + 0xf0) == 0) {
    if (*(long *)((long)pvVar1 + 0x118) == 0) {
      if (*(long *)((long)pvVar1 + 0x108) == 0) {
        if (*(int *)((long)pvVar1 + 0x114) == 0) {
          if (*(int *)((long)pvVar1 + 0x68) != 0) {
            archive_set_error(&a->archive,-1,"Malformed 7-Zip archive");
            return -0x1e;
          }
          if ((*(int *)((long)pvVar1 + 0x100) == 0) &&
             ((*(long *)(*(long *)((long)pvVar1 + 0x38) +
                         (ulong)*(uint *)(*(long *)((long)pvVar1 + 0xa8) + 0x10) * 0x68 + 0x60) != 0
              || (*(int *)((long)pvVar1 + 0x100) != *(int *)(*(long *)((long)pvVar1 + 0xa8) + 0x10))
              ))) {
            *(undefined4 *)((long)pvVar1 + 0x100) =
                 *(undefined4 *)(*(long *)((long)pvVar1 + 0xa8) + 0x10);
            r = *(ssize_t *)
                 (*(long *)((long)pvVar1 + 0x38) + (ulong)*(uint *)((long)pvVar1 + 0x100) * 0x68 +
                 0x60);
          }
          if (*(ulong *)((long)pvVar1 + 0x30) <= (ulong)*(uint *)((long)pvVar1 + 0x100)) {
            *buff = (void *)0x0;
            return 0;
          }
          iVar2 = setup_decode_folder(a,(_7z_folder *)
                                        (*(long *)((long)pvVar1 + 0x38) +
                                        (ulong)*(uint *)((long)pvVar1 + 0x100) * 0x68),0);
          if (iVar2 != 0) {
            return -0x1e;
          }
          *(int *)((long)pvVar1 + 0x100) = *(int *)((long)pvVar1 + 0x100) + 1;
        }
        iVar2 = seek_pack(a);
        a_local = (archive_read *)(long)iVar2;
        if ((-1 < (long)a_local) &&
           (a_local = (archive_read *)extract_pack_stream(a,0), -1 < (long)a_local)) {
          while (r != 0) {
            if (*(long *)((long)pvVar1 + 0xf0) == 0) {
              if (*(long *)((long)pvVar1 + 0x118) == 0) {
                if (*(long *)((long)pvVar1 + 0x108) == 0) {
                  archive_set_error(&a->archive,0x54,"Truncated 7-Zip file body");
                  return -0x1e;
                }
                lVar3 = extract_pack_stream(a,0);
              }
              else {
                lVar3 = extract_pack_stream(a,0);
              }
              if (lVar3 < 0) {
                return lVar3;
              }
            }
            sVar4 = get_uncompressed_data(a,buff,r,0);
            if (sVar4 < 0) {
              return sVar4;
            }
            r = r - sVar4;
            if (*(long *)((long)pvVar1 + 0x120) != 0) {
              read_consume(a);
            }
          }
          a_local = (archive_read *)get_uncompressed_data(a,buff,size,minimum);
        }
      }
      else {
        a_local = (archive_read *)extract_pack_stream(a,0);
        if (-1 < (long)a_local) {
          a_local = (archive_read *)get_uncompressed_data(a,buff,size,minimum);
        }
      }
    }
    else {
      a_local = (archive_read *)extract_pack_stream(a,0);
      if (-1 < (long)a_local) {
        a_local = (archive_read *)get_uncompressed_data(a,buff,size,minimum);
      }
    }
  }
  else {
    a_local = (archive_read *)get_uncompressed_data(a,buff,size,minimum);
  }
  return (ssize_t)a_local;
}

Assistant:

static ssize_t
read_stream(struct archive_read *a, const void **buff, size_t size,
    size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	uint64_t skip_bytes = 0;
	ssize_t r;

	if (zip->uncompressed_buffer_bytes_remaining == 0) {
		if (zip->pack_stream_inbytes_remaining > 0) {
			r = extract_pack_stream(a, 0);
			if (r < 0)
				return (r);
			return (get_uncompressed_data(a, buff, size, minimum));
		} else if (zip->folder_outbytes_remaining > 0) {
			/* Extract a remaining pack stream. */
			r = extract_pack_stream(a, 0);
			if (r < 0)
				return (r);
			return (get_uncompressed_data(a, buff, size, minimum));
		}
	} else
		return (get_uncompressed_data(a, buff, size, minimum));

	/*
	 * Current pack stream has been consumed.
	 */
	if (zip->pack_stream_remaining == 0) {
		if (zip->header_is_being_read) {
			/* Invalid sequence. This might happen when
			 * reading a malformed archive. */
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Malformed 7-Zip archive");
			return (ARCHIVE_FATAL);
		}

		/*
		 * All current folder's pack streams have been
		 * consumed. Switch to next folder.
		 */
		if (zip->folder_index == 0 &&
		    (zip->si.ci.folders[zip->entry->folderIndex].skipped_bytes
		     || zip->folder_index != zip->entry->folderIndex)) {
			zip->folder_index = zip->entry->folderIndex;
			skip_bytes =
			    zip->si.ci.folders[zip->folder_index].skipped_bytes;
		}

		if (zip->folder_index >= zip->si.ci.numFolders) {
			/*
			 * We have consumed all folders and its pack streams.
			 */
			*buff = NULL;
			return (0);
		}
		r = setup_decode_folder(a,
			&(zip->si.ci.folders[zip->folder_index]), 0);
		if (r != ARCHIVE_OK)
			return (ARCHIVE_FATAL);

		zip->folder_index++;
	}

	/*
	 * Switch to next pack stream.
	 */
	r = seek_pack(a);
	if (r < 0)
		return (r);

	/* Extract a new pack stream. */
	r = extract_pack_stream(a, 0);
	if (r < 0)
		return (r);

	/*
	 * Skip the bytes we already has skipped in skip_stream().
	 */
	while (skip_bytes) {
		ssize_t skipped;

		if (zip->uncompressed_buffer_bytes_remaining == 0) {
			if (zip->pack_stream_inbytes_remaining > 0) {
				r = extract_pack_stream(a, 0);
				if (r < 0)
					return (r);
			} else if (zip->folder_outbytes_remaining > 0) {
				/* Extract a remaining pack stream. */
				r = extract_pack_stream(a, 0);
				if (r < 0)
					return (r);
			} else {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Truncated 7-Zip file body");
				return (ARCHIVE_FATAL);
			}
		}
		skipped = get_uncompressed_data(
			a, buff, (size_t)skip_bytes, 0);
		if (skipped < 0)
			return (skipped);
		skip_bytes -= skipped;
		if (zip->pack_stream_bytes_unconsumed)
			read_consume(a);
	}

	return (get_uncompressed_data(a, buff, size, minimum));
}